

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O0

bool __thiscall S2Cell::UEdgeIsClosest(S2Cell *this,S2Point *p,int v_end)

{
  R1Interval *pRVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool local_69;
  undefined1 local_68 [8];
  S2Point dir1;
  S2Point dir0;
  double v;
  double u1;
  double u0;
  int v_end_local;
  S2Point *p_local;
  S2Cell *this_local;
  
  pRVar1 = R2Rect::operator[](&this->uv_,0);
  dVar2 = R1Interval::operator[](pRVar1,0);
  pRVar1 = R2Rect::operator[](&this->uv_,0);
  dVar3 = R1Interval::operator[](pRVar1,1);
  pRVar1 = R2Rect::operator[](&this->uv_,1);
  dVar4 = R1Interval::operator[](pRVar1,v_end);
  Vector3<double>::Vector3
            ((Vector3<double> *)(dir1.c_ + 2),dVar4 * dVar4 + 1.0,-dVar2 * dVar4,-dVar2);
  Vector3<double>::Vector3((Vector3<double> *)local_68,dVar4 * dVar4 + 1.0,-dVar3 * dVar4,-dVar3);
  dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)p,(D *)(dir1.c_ + 2));
  local_69 = false;
  if (0.0 < dVar2) {
    dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)p,(D *)local_68);
    local_69 = dVar2 < 0.0;
  }
  return local_69;
}

Assistant:

bool S2Cell::UEdgeIsClosest(const S2Point& p, int v_end) const {
  double u0 = uv_[0][0], u1 = uv_[0][1], v = uv_[1][v_end];
  // These are the normals to the planes that are perpendicular to the edge
  // and pass through one of its two endpoints.
  S2Point dir0(v * v + 1, -u0 * v, -u0);
  S2Point dir1(v * v + 1, -u1 * v, -u1);
  return p.DotProd(dir0) > 0 && p.DotProd(dir1) < 0;
}